

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_DRBG.c
# Opt level: O3

_Bool EverCrypt_DRBG_generate
                (uint8_t *output,EverCrypt_DRBG_state_s *st,uint32_t n,uint8_t *additional_input,
                uint32_t additional_input_len)

{
  uint *puVar1;
  undefined1 *puVar2;
  undefined1 uVar3;
  _Bool _Var4;
  uint32_t len;
  undefined7 extraout_var;
  uint extraout_EDX;
  uint uVar5;
  undefined8 uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t *dst;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  uint8_t auStack_c8 [8];
  uint8_t *puStack_c0;
  ulong uStack_b8;
  undefined8 uStack_b0;
  uint8_t *puStack_a8;
  uint8_t *puStack_a0;
  ulong uStack_98;
  uint8_t *puStack_90;
  uint uStack_84;
  uint32_t *puStack_80;
  ulong uStack_78;
  uint8_t *puStack_70;
  undefined1 *puStack_68;
  uint8_t *puStack_60;
  uint8_t *puStack_58;
  uint8_t *puStack_50;
  EverCrypt_DRBG_state_s *pEStack_48;
  uint8_t *puStack_40;
  ulong __n;
  
  switch(st->tag) {
  case '\0':
    _Var4 = generate_sha1(output,st,n,additional_input,additional_input_len);
    return _Var4;
  case '\x01':
    _Var4 = generate_sha2_256(output,st,n,additional_input,additional_input_len);
    return _Var4;
  case '\x02':
    _Var4 = generate_sha2_384(output,st,n,additional_input,additional_input_len);
    return _Var4;
  case '\x03':
    _Var4 = generate_sha2_512(output,st,n,additional_input,additional_input_len);
    return _Var4;
  }
  EverCrypt_DRBG_generate_cold_1();
  puStack_68 = (undefined1 *)&puStack_c0;
  uVar3 = 0;
  if ((additional_input_len <= Hacl_HMAC_DRBG_max_additional_input_length) &&
     (extraout_EDX <= Hacl_HMAC_DRBG_max_output_length)) {
    uVar17 = (ulong)additional_input_len;
    puStack_70 = (uint8_t *)CONCAT44(puStack_70._4_4_,extraout_EDX);
    auStack_c8[0] = 0x94;
    auStack_c8[1] = '\x1a';
    auStack_c8[2] = '\x17';
    auStack_c8[3] = '\0';
    auStack_c8[4] = '\0';
    auStack_c8[5] = '\0';
    auStack_c8[6] = '\0';
    auStack_c8[7] = '\0';
    puStack_50 = output;
    pEStack_48 = st;
    len = Hacl_HMAC_DRBG_min_length('\x04');
    uVar8 = (ulong)len;
    lVar16 = -(uVar8 + 0xf & 0xfffffffffffffff0);
    puVar12 = (uint8_t *)((long)&puStack_c0 + lVar16);
    puVar10 = auStack_c8 + lVar16;
    puVar10[0] = 0xbb;
    puVar10[1] = '\x1a';
    puVar10[2] = '\x17';
    puVar10[3] = '\0';
    puVar10[4] = '\0';
    puVar10[5] = '\0';
    puVar10[6] = '\0';
    puVar10[7] = '\0';
    memset(puVar12,0,uVar8);
    puVar11 = auStack_c8 + lVar16;
    puVar11[0] = 0xc5;
    puVar11[1] = '\x1a';
    puVar11[2] = '\x17';
    puVar11[3] = '\0';
    puVar11[4] = '\0';
    puVar11[5] = '\0';
    puVar11[6] = '\0';
    puVar11[7] = '\0';
    _Var4 = Lib_RandomBuffer_System_randombytes(puVar12,len);
    uVar14 = CONCAT71(extraout_var,_Var4);
    if (_Var4) {
      uStack_84 = (uint)uVar14;
      puStack_90 = (pEStack_48->field_1).case_SHA1_s.k;
      puStack_c0 = (pEStack_48->field_1).case_SHA1_s.v;
      puStack_80 = (pEStack_48->field_1).case_SHA1_s.reseed_counter;
      uVar14 = (ulong)(len + additional_input_len);
      puStack_58 = (uint8_t *)CONCAT71(puStack_58._1_7_,pEStack_48->tag);
      lVar16 = -(uVar14 + 0xf & 0xfffffffffffffff0);
      puVar7 = puVar12 + lVar16;
      uStack_b8 = uVar14;
      builtin_memcpy(puVar12 + lVar16 + -8,"\x1a\x1b\x17",4);
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      memset(puVar7,0,uVar14);
      builtin_memcpy(puVar12 + lVar16 + -8,"(\x1b\x17",4);
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      memcpy(puVar7,puVar12,uVar8);
      puStack_40 = puVar7;
      puStack_60 = additional_input;
      uStack_78 = uVar17;
      builtin_memcpy(puVar12 + lVar16 + -8,"C\x1b\x17",4);
      puVar7[-4] = '\0';
      puVar7[-3] = '\0';
      puVar7[-2] = '\0';
      puVar7[-1] = '\0';
      memcpy(puVar7 + uVar8,additional_input,uVar17);
      if ((char)puStack_58 != '\0') {
        uVar6 = 0x3c0;
LAB_001720e2:
        puVar7[-8] = 0xe9;
        puVar7[-7] = ' ';
        puVar7[-6] = '\x17';
        puVar7[-5] = '\0';
        puVar7[-4] = '\0';
        puVar7[-3] = '\0';
        puVar7[-2] = '\0';
        puVar7[-1] = '\0';
        printf("KaRaMeL abort at %s:%d\n%s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_DRBG.c"
               ,uVar6,"unreachable (pattern matches are exhaustive in F*)");
        *(code **)(puVar7 + -8) = generate_sha2_256;
        exit(0xff);
      }
      uVar15 = len + additional_input_len + 0x15;
      __n = (ulong)uVar15;
      uVar8 = __n + 0xf & 0xfffffffffffffff0;
      puVar13 = puVar7 + -uVar8;
      puStack_58 = (uint8_t *)uVar17;
      puVar13[-8] = 'z';
      puVar13[-7] = '\x1b';
      puVar13[-6] = '\x17';
      puVar13[-5] = '\0';
      puVar13[-4] = '\0';
      puVar13[-3] = '\0';
      puVar13[-2] = '\0';
      puVar13[-1] = '\0';
      memset(puVar13,0,__n);
      puVar9 = puStack_c0;
      *(undefined4 *)(puVar7 + -uVar8 + 0x10) = *(undefined4 *)(puStack_c0 + 0x10);
      uVar6 = *(undefined8 *)(puStack_c0 + 8);
      *(undefined8 *)puVar13 = *(undefined8 *)puStack_c0;
      *(undefined8 *)(puVar13 + 8) = uVar6;
      puVar7 = puStack_40;
      uVar14 = uStack_b8;
      if (uStack_b8 == 0) {
        puVar13[0x14] = '\0';
        puVar12 = puStack_90;
        puVar13[-8] = 0xe0;
        puVar13[-7] = '\x1c';
        puVar13[-6] = '\x17';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar13,puVar12,0x14,puVar13,uVar15);
        puVar13[-8] = 0xf9;
        puVar13[-7] = '\x1c';
        puVar13[-6] = '\x17';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar9,puVar13,0x14,puVar9,0x14);
        *(undefined4 *)(puVar12 + 0x10) = *(undefined4 *)(puVar13 + 0x10);
        uVar6 = *(undefined8 *)(puVar13 + 8);
        *(undefined8 *)puVar12 = *(undefined8 *)puVar13;
        *(undefined8 *)(puVar12 + 8) = uVar6;
      }
      else {
        uStack_b0 = -uVar8;
        puVar13[-8] = 0xc2;
        puVar13[-7] = '\x1b';
        puVar13[-6] = '\x17';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        memcpy(puVar13 + 0x15,puVar7,uVar14);
        puVar13[0x14] = '\0';
        puVar7 = puStack_90;
        uStack_98 = __n;
        puVar13[-8] = 0xe9;
        puVar13[-7] = '\x1b';
        puVar13[-6] = '\x17';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar13,puVar7,0x14,puVar13,uVar15);
        builtin_memcpy(puVar12 + -uVar8 + lVar16 + -8,"\x02\x1c\x17",4);
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar9,puVar13,0x14,puVar9,0x14);
        uVar17 = uStack_98;
        puStack_a8 = puVar13;
        *(undefined4 *)(puVar7 + 0x10) = *(undefined4 *)(puVar13 + 0x10);
        uVar6 = *(undefined8 *)(puVar13 + 8);
        *(undefined8 *)puVar7 = *(undefined8 *)puVar13;
        *(undefined8 *)(puVar7 + 8) = uVar6;
        dst = puVar13 + -uVar8;
        puStack_a0 = puVar13;
        dst[-8] = '?';
        dst[-7] = '\x1c';
        dst[-6] = '\x17';
        dst[-5] = '\0';
        dst[-4] = '\0';
        dst[-3] = '\0';
        dst[-2] = '\0';
        dst[-1] = '\0';
        memset(dst,0,uVar17);
        uVar6 = *(undefined8 *)(puVar9 + 8);
        *(undefined8 *)dst = *(undefined8 *)puVar9;
        *(undefined8 *)(dst + 8) = uVar6;
        *(undefined4 *)(dst + 0x10) = *(undefined4 *)(puVar9 + 0x10);
        puVar12 = puStack_40;
        dst[-8] = 'c';
        dst[-7] = '\x1c';
        dst[-6] = '\x17';
        dst[-5] = '\0';
        dst[-4] = '\0';
        dst[-3] = '\0';
        dst[-2] = '\0';
        dst[-1] = '\0';
        memcpy(dst + 0x15,puVar12,uVar14);
        dst[0x14] = '\x01';
        dst[-8] = '\x7f';
        dst[-7] = '\x1c';
        dst[-6] = '\x17';
        dst[-5] = '\0';
        dst[-4] = '\0';
        dst[-3] = '\0';
        dst[-2] = '\0';
        dst[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(dst,puVar7,0x14,dst,(uint32_t)uVar17);
        dst[-8] = 0x98;
        dst[-7] = '\x1c';
        dst[-6] = '\x17';
        dst[-5] = '\0';
        dst[-4] = '\0';
        dst[-3] = '\0';
        dst[-2] = '\0';
        dst[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar9,dst,0x14,puVar9,0x14);
        *(undefined4 *)(puVar7 + 0x10) = *(undefined4 *)(dst + 0x10);
        uVar6 = *(undefined8 *)(puStack_a0 + uStack_b0 + 8);
        *(undefined8 *)puVar7 = *(undefined8 *)(puStack_a0 + uStack_b0);
        *(undefined8 *)(puVar7 + 8) = uVar6;
      }
      puVar12 = puStack_60;
      *puStack_80 = 1;
      if (pEStack_48->tag != '\0') {
        uVar6 = 0x3f9;
        puVar7 = puStack_68;
        goto LAB_001720e2;
      }
      puVar1 = (pEStack_48->field_1).case_SHA1_s.reseed_counter;
      if (Hacl_HMAC_DRBG_reseed_interval < *puVar1) {
        return false;
      }
      uVar15 = (int)puStack_58 + 0x15;
      puStack_40 = (pEStack_48->field_1).case_SHA1_s.k;
      puVar7 = (pEStack_48->field_1).case_SHA1_s.v;
      uVar14 = (ulong)uVar15;
      puVar9 = puStack_50;
      puStack_80 = puVar1;
      pEStack_48 = (EverCrypt_DRBG_state_s *)uVar14;
      if ((int)puStack_58 != 0) {
        uVar17 = uVar14 + 0xf & 0xfffffffffffffff0;
        puVar13 = puStack_68 + -uVar17;
        puVar13[-8] = 0x95;
        puVar13[-7] = '\x1d';
        puVar13[-6] = '\x17';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        memset(puVar13,0,uVar14);
        uVar14 = uStack_78;
        uVar6 = *(undefined8 *)(puVar7 + 8);
        *(undefined8 *)puVar13 = *(undefined8 *)puVar7;
        *(undefined8 *)(puVar13 + 8) = uVar6;
        *(undefined4 *)(puVar13 + 0x10) = *(undefined4 *)(puVar7 + 0x10);
        puVar13[-8] = 0xb8;
        puVar13[-7] = '\x1d';
        puVar13[-6] = '\x17';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        memcpy(puVar13 + 0x15,puVar12,uStack_78);
        puVar13[0x14] = '\0';
        puVar13[-8] = 0xd3;
        puVar13[-7] = '\x1d';
        puVar13[-6] = '\x17';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar13,puStack_40,0x14,puVar13,uVar15);
        puVar13[-8] = 0xec;
        puVar13[-7] = '\x1d';
        puVar13[-6] = '\x17';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar7,puVar13,0x14,puVar7,0x14);
        *(undefined4 *)(puStack_40 + 0x10) = *(undefined4 *)(puVar13 + 0x10);
        uVar6 = *(undefined8 *)(puVar13 + 8);
        *(undefined8 *)puStack_40 = *(undefined8 *)puVar13;
        *(undefined8 *)(puStack_40 + 8) = uVar6;
        puVar13 = puVar13 + -uVar17;
        puVar13[-8] = '\x17';
        puVar13[-7] = '\x1e';
        puVar13[-6] = '\x17';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        memset(puVar13,0,(size_t)pEStack_48);
        puVar9 = puStack_50;
        uVar6 = *(undefined8 *)(puVar7 + 8);
        *(undefined8 *)puVar13 = *(undefined8 *)puVar7;
        *(undefined8 *)(puVar13 + 8) = uVar6;
        *(undefined4 *)(puVar13 + 0x10) = *(undefined4 *)(puVar7 + 0x10);
        puVar13[-8] = ';';
        puVar13[-7] = '\x1e';
        puVar13[-6] = '\x17';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        memcpy(puVar13 + 0x15,puStack_60,uVar14);
        puVar13[0x14] = '\x01';
        puVar13[-8] = 'V';
        puVar13[-7] = '\x1e';
        puVar13[-6] = '\x17';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar13,puStack_40,0x14,puVar13,uVar15);
        puVar13[-8] = 'o';
        puVar13[-7] = '\x1e';
        puVar13[-6] = '\x17';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar7,puVar13,0x14,puVar7,0x14);
        *(undefined4 *)(puStack_40 + 0x10) = *(undefined4 *)(puVar13 + 0x10);
        uVar6 = *(undefined8 *)(puVar13 + 8);
        *(undefined8 *)puStack_40 = *(undefined8 *)puVar13;
        *(undefined8 *)(puStack_40 + 8) = uVar6;
      }
      puVar2 = puStack_68;
      puStack_50 = (uint8_t *)CONCAT44(puStack_50._4_4_,uVar15);
      uVar15 = (uint)puStack_70 / 0x14;
      if (0x13 < (uint)puStack_70) {
        lVar16 = 0;
        do {
          *(undefined8 *)(puVar2 + -8) = 0x171ec2;
          EverCrypt_HMAC_compute_sha1(puVar7,puStack_40,0x14,puVar7,0x14);
          *(undefined4 *)(puVar9 + lVar16 + 0x10) = *(undefined4 *)(puVar7 + 0x10);
          uVar6 = *(undefined8 *)(puVar7 + 8);
          *(undefined8 *)(puVar9 + lVar16) = *(undefined8 *)puVar7;
          *(undefined8 *)(puVar9 + lVar16 + 8) = uVar6;
          lVar16 = lVar16 + 0x14;
        } while ((ulong)(uVar15 * 4) * 5 != lVar16);
      }
      if (uVar15 * 0x14 < (uint)puStack_70) {
        uVar5 = (uint)puStack_70 + uVar15 * -0x14;
        *(undefined8 *)(puVar2 + -8) = 0x171f10;
        EverCrypt_HMAC_compute_sha1(puVar7,puStack_40,0x14,puVar7,0x14);
        *(undefined8 *)(puVar2 + -8) = 0x171f1d;
        memcpy(puVar9 + uVar15 * 0x14,puVar7,(ulong)uVar5);
      }
      uVar14 = (long)pEStack_48 + 0xfU & 0xfffffffffffffff0;
      lVar16 = -uVar14;
      puVar9 = puVar2 + lVar16;
      puVar9[-8] = 'C';
      puVar9[-7] = '\x1f';
      puVar9[-6] = '\x17';
      puVar9[-5] = '\0';
      puVar9[-4] = '\0';
      puVar9[-3] = '\0';
      puVar9[-2] = '\0';
      puVar9[-1] = '\0';
      puStack_68 = puVar2;
      memset(puVar9,0,(size_t)pEStack_48);
      puVar12 = puStack_40;
      *(undefined4 *)(puVar2 + -uVar14 + 0x10) = *(undefined4 *)(puVar7 + 0x10);
      uVar6 = *(undefined8 *)(puVar7 + 8);
      *(undefined8 *)puVar9 = *(undefined8 *)puVar7;
      *(undefined8 *)(puVar9 + 8) = uVar6;
      if ((int)puStack_58 == 0) {
        puVar9[0x14] = '\0';
        builtin_memcpy(puVar2 + lVar16 + -8,"i \x17",4);
        puVar9[-4] = '\0';
        puVar9[-3] = '\0';
        puVar9[-2] = '\0';
        puVar9[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar9,puStack_40,0x14,puVar9,(uint32_t)puStack_50);
        puVar9[-8] = 0x82;
        puVar9[-7] = ' ';
        puVar9[-6] = '\x17';
        puVar9[-5] = '\0';
        puVar9[-4] = '\0';
        puVar9[-3] = '\0';
        puVar9[-2] = '\0';
        puVar9[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar7,puVar9,0x14,puVar7,0x14);
        *(undefined4 *)(puVar12 + 0x10) = *(undefined4 *)(puVar9 + 0x10);
        uVar6 = *(undefined8 *)(puVar9 + 8);
        *(undefined8 *)puVar12 = *(undefined8 *)puVar9;
        *(undefined8 *)(puVar12 + 8) = uVar6;
      }
      else {
        builtin_memcpy(puVar2 + lVar16 + -8,"v\x1f\x17",4);
        puVar9[-4] = '\0';
        puVar9[-3] = '\0';
        puVar9[-2] = '\0';
        puVar9[-1] = '\0';
        memcpy(puVar9 + 0x15,puStack_60,uStack_78);
        puVar12 = puStack_40;
        puVar9[0x14] = '\0';
        puVar9[-8] = 0x95;
        puVar9[-7] = '\x1f';
        puVar9[-6] = '\x17';
        puVar9[-5] = '\0';
        puVar9[-4] = '\0';
        puVar9[-3] = '\0';
        puVar9[-2] = '\0';
        puVar9[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar9,puStack_40,0x14,puVar9,(uint32_t)puStack_50);
        puVar9[-8] = 0xae;
        puVar9[-7] = '\x1f';
        puVar9[-6] = '\x17';
        puVar9[-5] = '\0';
        puVar9[-4] = '\0';
        puVar9[-3] = '\0';
        puVar9[-2] = '\0';
        puVar9[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar7,puVar9,0x14,puVar7,0x14);
        *(undefined4 *)(puVar12 + 0x10) = *(undefined4 *)(puVar9 + 0x10);
        uVar6 = *(undefined8 *)(puVar9 + 8);
        *(undefined8 *)puVar12 = *(undefined8 *)puVar9;
        *(undefined8 *)(puVar12 + 8) = uVar6;
        puVar13 = puVar9 + -uVar14;
        puVar13[-8] = 0xdb;
        puVar13[-7] = '\x1f';
        puVar13[-6] = '\x17';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        puStack_70 = puVar9;
        puStack_58 = puVar9;
        memset(puVar13,0,(size_t)pEStack_48);
        uVar6 = *(undefined8 *)(puVar7 + 8);
        *(undefined8 *)puVar13 = *(undefined8 *)puVar7;
        *(undefined8 *)(puVar13 + 8) = uVar6;
        *(undefined4 *)(puVar13 + 0x10) = *(undefined4 *)(puVar7 + 0x10);
        puVar13[-8] = 0xfc;
        puVar13[-7] = '\x1f';
        puVar13[-6] = '\x17';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        memcpy(puVar13 + 0x15,puStack_60,uStack_78);
        puVar13[0x14] = '\x01';
        puVar13[-8] = '\x17';
        puVar13[-7] = ' ';
        puVar13[-6] = '\x17';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar13,puVar12,0x14,puVar13,(uint32_t)puStack_50);
        puVar13[-8] = '0';
        puVar13[-7] = ' ';
        puVar13[-6] = '\x17';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar7,puVar13,0x14,puVar7,0x14);
        *(undefined4 *)(puVar12 + 0x10) = *(undefined4 *)(puVar13 + 0x10);
        uVar6 = *(undefined8 *)(puStack_58 + -uVar14 + 8);
        *(undefined8 *)puVar12 = *(undefined8 *)(puStack_58 + -uVar14);
        *(undefined8 *)(puVar12 + 8) = uVar6;
      }
      *puStack_80 = *puStack_80 + 1;
      uVar14 = (ulong)uStack_84;
    }
    uVar3 = (undefined1)uVar14;
  }
  return (_Bool)uVar3;
}

Assistant:

bool
EverCrypt_DRBG_generate(
  uint8_t *output,
  EverCrypt_DRBG_state_s *st,
  uint32_t n,
  uint8_t *additional_input,
  uint32_t additional_input_len
)
{
  EverCrypt_DRBG_state_s scrut = *st;
  if (scrut.tag == SHA1_s)
  {
    return generate_sha1(output, st, n, additional_input, additional_input_len);
  }
  if (scrut.tag == SHA2_256_s)
  {
    return generate_sha2_256(output, st, n, additional_input, additional_input_len);
  }
  if (scrut.tag == SHA2_384_s)
  {
    return generate_sha2_384(output, st, n, additional_input, additional_input_len);
  }
  if (scrut.tag == SHA2_512_s)
  {
    return generate_sha2_512(output, st, n, additional_input, additional_input_len);
  }
  KRML_HOST_EPRINTF("KaRaMeL abort at %s:%d\n%s\n",
    __FILE__,
    __LINE__,
    "unreachable (pattern matches are exhaustive in F*)");
  KRML_HOST_EXIT(255U);
}